

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bcon-extract.c
# Opt level: O1

void test_codewscope(void)

{
  char cVar1;
  char extraout_AL;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  void *pvVar6;
  ulong uVar7;
  ulong uVar8;
  undefined8 uVar9;
  void *pvVar10;
  void *pvVar11;
  undefined8 uVar12;
  int extraout_var;
  long extraout_RAX;
  undefined8 extraout_RAX_00;
  undefined8 extraout_RAX_01;
  bson_t *bson;
  char *__buf;
  char *__n;
  char *pcVar13;
  char *pcVar14;
  size_t sVar15;
  size_t sVar16;
  DIR *__dirp;
  dirent *pdVar17;
  FILE *__stream;
  long lVar18;
  uint extraout_EDX;
  char *__dest;
  ulong uVar19;
  char *pcVar20;
  DIR *__s;
  DIR *__name;
  char *pcVar21;
  DIR *pDVar22;
  DIR *__filename;
  undefined8 uVar23;
  DIR *pDVar24;
  undefined1 *puVar25;
  char *pcVar26;
  char *pcVar27;
  char *__n_00;
  undefined8 extraout_XMM1_Qa;
  undefined8 extraout_XMM1_Qa_00;
  undefined8 extraout_XMM1_Qa_01;
  undefined8 extraout_XMM1_Qa_02;
  char *code;
  bson_t oscope;
  undefined1 auStack_7518 [8];
  undefined1 auStack_7510 [504];
  ulong uStack_7318;
  DIR *pDStack_7310;
  char *pcStack_7308;
  DIR *pDStack_7300;
  DIR *pDStack_72f8;
  int iStack_72ec;
  DIR *pDStack_72e8;
  stat sStack_72e0;
  char acStack_7250 [512];
  size_t sStack_7050;
  char *pcStack_7048;
  DIR *pDStack_7040;
  char *pcStack_7038;
  code *pcStack_7030;
  char *pcStack_7028;
  ulong uStack_7020;
  char *pcStack_7018;
  DIR *pDStack_7010;
  undefined8 *puStack_7008;
  undefined8 uStack_6fd0;
  undefined1 *puStack_6fc8;
  undefined1 *puStack_6fc0;
  undefined1 auStack_6fb0 [8];
  char *pcStack_6fa8;
  undefined8 uStack_6f98;
  char *pcStack_6f90;
  undefined8 uStack_6f88;
  undefined8 uStack_6f70;
  DIR aDStack_6f00 [25944];
  char *pcStack_9a8;
  char *pcStack_9a0;
  char *pcStack_998;
  char *pcStack_990;
  code *apcStack_988 [2];
  undefined1 auStack_978 [116];
  uint uStack_904;
  char acStack_900 [256];
  undefined8 uStack_800;
  char *pcStack_7f8;
  char *pcStack_7f0;
  char *pcStack_7e8;
  char *pcStack_7e0;
  char *pcStack_7d8;
  char *pcStack_7d0;
  undefined8 uStack_7c8;
  code *pcStack_7c0;
  char *pcStack_7b8;
  undefined8 uStack_7b0;
  char *pcStack_7a8;
  char *pcStack_7a0;
  char *pcStack_798;
  char *pcStack_790;
  code *pcStack_788;
  undefined8 uStack_780;
  undefined8 uStack_778;
  char *pcStack_770;
  char *pcStack_768;
  char *pcStack_760;
  undefined8 uStack_758;
  bson_t *pbStack_750;
  char *pcStack_748;
  code *pcStack_740;
  undefined8 uStack_738;
  undefined8 uStack_730;
  undefined8 uStack_728;
  char *pcStack_720;
  char *pcStack_718;
  char *pcStack_710;
  char *pcStack_708;
  char *pcStack_700;
  code *pcStack_6f8;
  undefined8 uStack_6f0;
  undefined8 uStack_6e8;
  undefined8 uStack_6e0;
  undefined1 *puStack_6d8;
  char *pcStack_6d0;
  char *pcStack_6c8;
  code *pcStack_6c0;
  undefined8 uStack_6b8;
  ulong uStack_6b0;
  ulong uStack_6a8;
  undefined1 *puStack_6a0;
  char *pcStack_698;
  void *pvStack_690;
  code *pcStack_688;
  uint uStack_604;
  undefined1 auStack_600 [4];
  uint uStack_5fc;
  ulong uStack_4b0;
  ulong uStack_4a8;
  undefined1 *puStack_4a0;
  char *pcStack_498;
  void *pvStack_490;
  code *apcStack_488 [16];
  uint uStack_404;
  undefined1 auStack_400 [4];
  uint uStack_3fc;
  undefined8 uStack_2b8;
  ulong uStack_2b0;
  undefined1 *puStack_2a8;
  char *pcStack_2a0;
  undefined8 uStack_298;
  code *apcStack_290 [2];
  undefined8 uStack_280;
  code *pcStack_278;
  undefined8 uStack_268;
  code *pcStack_260;
  long lStack_258;
  undefined8 uStack_250;
  code *pcStack_248;
  undefined8 uStack_240;
  int iStack_238;
  int iStack_234;
  undefined8 uStack_230;
  char *pcStack_228;
  code *pcStack_220;
  int iStack_214;
  ulong uStack_210;
  code *pcStack_208;
  undefined8 local_200;
  uint local_18c;
  char *local_188;
  undefined1 local_180 [4];
  uint local_17c;
  
  pcStack_208 = (code *)0x13bb30;
  pvVar6 = (void *)bson_bcon_magic();
  puVar25 = (undefined1 *)0x0;
  pcStack_208 = (code *)0x13bb57;
  uVar7 = bcon_new(0,"b",pvVar6,0xf,10,0);
  local_200 = 0;
  pcVar27 = "foo";
  pcStack_208 = (code *)0x13bb83;
  uVar8 = bcon_new(0,"foo",pvVar6,0xe,"var a = b;",uVar7);
  pcStack_208 = (code *)0x13bb8b;
  uVar9 = bson_bcone_magic();
  local_200 = 0;
  pcStack_208 = (code *)0x13bbb1;
  cVar1 = bcon_extract(uVar8,"foo",uVar9,0xe,&local_188,local_180);
  if (cVar1 == '\0') {
LAB_0013bd4d:
    pcStack_208 = (code *)0x13bd52;
    test_codewscope_cold_1();
LAB_0013bd52:
    pcStack_208 = (code *)0x13bd57;
    test_codewscope_cold_2();
LAB_0013bd57:
    pcStack_208 = (code *)0x13bd5c;
    test_codewscope_cold_7();
LAB_0013bd5c:
    pcStack_208 = (code *)0x13bd61;
    test_codewscope_cold_6();
LAB_0013bd61:
    pcStack_208 = (code *)0x13bd66;
    test_codewscope_cold_3();
  }
  else {
    pcStack_208 = (code *)0x13bbca;
    iVar2 = strcmp(local_188,"var a = b;");
    if (iVar2 != 0) goto LAB_0013bd52;
    pcStack_208 = (code *)0x13bbe2;
    pcVar27 = (char *)bson_get_data(local_180);
    pcStack_208 = (code *)0x13bbed;
    pvVar6 = (void *)bson_get_data(uVar7);
    if (*(uint *)(uVar7 + 4) == local_17c) {
      pcStack_208 = (code *)0x13bc01;
      pvVar10 = (void *)bson_get_data(uVar7);
      pcStack_208 = (code *)0x13bc11;
      pvVar11 = (void *)bson_get_data(local_180);
      pcStack_208 = (code *)0x13bc1f;
      iVar2 = bcmp(pvVar10,pvVar11,(ulong)*(uint *)(uVar7 + 4));
      if (iVar2 == 0) {
        pcStack_208 = (code *)0x13bc30;
        bson_destroy(local_180);
        pcStack_208 = (code *)0x13bc38;
        bson_destroy(uVar7);
        pcStack_208 = (code *)0x13bc40;
        bson_destroy(uVar8);
        return;
      }
    }
    puVar25 = local_180;
    pcStack_208 = (code *)0x13bc61;
    uVar9 = bson_as_canonical_extended_json(puVar25);
    pcStack_208 = (code *)0x13bc6e;
    uVar12 = bson_as_canonical_extended_json(uVar7);
    uVar8 = 0xffffffff;
    if (local_17c != 0) {
      uVar19 = 0;
      do {
        if (*(int *)(uVar7 + 4) == (int)uVar19) break;
        if (pcVar27[uVar19] != *(char *)((long)pvVar6 + uVar19)) {
          uVar8 = uVar19 & 0xffffffff;
          break;
        }
        uVar19 = uVar19 + 1;
      } while (local_17c != (uint)uVar19);
    }
    if ((int)uVar8 == -1) {
      uVar3 = local_17c;
      if (local_17c < *(uint *)(uVar7 + 4)) {
        uVar3 = *(uint *)(uVar7 + 4);
      }
      uVar8 = (ulong)(uVar3 - 1);
    }
    pcStack_208 = (code *)0x13bcc9;
    fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar8,uVar9,uVar12);
    pcStack_208 = (code *)0x13bce1;
    uVar3 = open("failure.bad.bson",0x42,0x1a0);
    uVar8 = (ulong)uVar3;
    pcStack_208 = (code *)0x13bcfc;
    uVar4 = open("failure.expected.bson",0x42,0x1a0);
    local_18c = uVar3;
    if (uVar3 == 0xffffffff) goto LAB_0013bd57;
    puVar25 = (undefined1 *)(ulong)uVar4;
    if (uVar4 == 0xffffffff) goto LAB_0013bd5c;
    uVar8 = (ulong)local_17c;
    pcStack_208 = (code *)0x13bd26;
    uVar19 = write(uVar3,pcVar27,uVar8);
    if (uVar19 != uVar8) goto LAB_0013bd61;
    uVar7 = (ulong)*(uint *)(uVar7 + 4);
    pcStack_208 = (code *)0x13bd3c;
    uVar19 = write(uVar4,pvVar6,uVar7);
    if (uVar19 == uVar7) {
      pcStack_208 = (code *)0x13bd4d;
      test_codewscope_cold_5();
      goto LAB_0013bd4d;
    }
  }
  pcStack_208 = test_int32;
  test_codewscope_cold_4();
  pcStack_220 = (code *)0x13bd74;
  uStack_210 = uVar7;
  pcStack_208 = (code *)pvVar6;
  iStack_214 = extraout_var;
  uVar9 = bson_bcon_magic();
  pcStack_220 = (code *)0x13bd98;
  uVar9 = bcon_new(0,"foo",uVar9,0xf,10,0);
  pcStack_220 = (code *)0x13bda0;
  uVar12 = bson_bcone_magic();
  pcStack_220 = (code *)0x13bdbd;
  cVar1 = bcon_extract(uVar9,"foo",uVar12,0xf,&iStack_214,0);
  if (cVar1 == '\0') {
    pcStack_220 = (code *)0x13bddd;
    test_int32_cold_1();
  }
  else if (iStack_214 == 10) {
    pcStack_220 = (code *)0x13bdd0;
    bson_destroy(uVar9);
    return;
  }
  pcStack_220 = test_timestamp;
  test_int32_cold_2();
  pcStack_228 = "foo";
  pcStack_248 = (code *)0x13bdf0;
  uStack_230 = uVar9;
  pcStack_220 = (code *)pcVar27;
  uVar9 = bson_bcon_magic();
  pvVar6 = (void *)0x0;
  uStack_240 = 0;
  pcStack_248 = (code *)0x13be1e;
  uVar9 = bcon_new(0,"foo",uVar9,0x10,100,1000);
  pcStack_248 = (code *)0x13be26;
  uVar12 = bson_bcone_magic();
  uStack_240 = 0;
  pcStack_248 = (code *)0x13be49;
  cVar1 = bcon_extract(uVar9,"foo",uVar12,0x10,&iStack_234,&iStack_238);
  if (cVar1 == '\0') {
    pcStack_248 = (code *)0x13be75;
    test_timestamp_cold_1();
LAB_0013be75:
    pcStack_248 = (code *)0x13be7a;
    test_timestamp_cold_2();
  }
  else {
    if (iStack_234 != 100) goto LAB_0013be75;
    if (iStack_238 == 1000) {
      pcStack_248 = (code *)0x13be66;
      bson_destroy(uVar9);
      return;
    }
  }
  pcStack_248 = test_int64;
  test_timestamp_cold_3();
  pcStack_248 = (code *)0x13e3df;
  pcStack_260 = (code *)0x13be88;
  lStack_258 = extraout_RAX;
  uStack_250 = uVar9;
  uVar9 = bson_bcon_magic();
  pcStack_260 = (code *)0x13beac;
  uVar9 = bcon_new(0,"foo",uVar9,0x11,10,0);
  pcStack_260 = (code *)0x13beb4;
  uVar12 = bson_bcone_magic();
  pcStack_260 = (code *)0x13becf;
  cVar1 = bcon_extract(uVar9,"foo",uVar12,0x11,&lStack_258,0);
  if (cVar1 == '\0') {
    pcStack_260 = (code *)0x13beef;
    test_int64_cold_1();
  }
  else if (lStack_258 == 10) {
    pcStack_260 = (code *)0x13bee2;
    bson_destroy(uVar9);
    return;
  }
  pcStack_260 = test_maxkey;
  test_int64_cold_2();
  pcStack_260 = (code *)0x13e3df;
  pcStack_278 = (code *)0x13befd;
  uStack_268 = uVar9;
  uVar9 = bson_bcon_magic();
  pcStack_278 = (code *)0x13bf1b;
  uVar9 = bcon_new(0,"foo",uVar9,0x13,0);
  pcStack_278 = (code *)0x13bf23;
  uVar12 = bson_bcone_magic();
  pcStack_278 = (code *)0x13bf3b;
  cVar1 = bcon_extract(uVar9,"foo",uVar12,0x13,0);
  if (cVar1 != '\0') {
    bson_destroy(uVar9);
    return;
  }
  pcStack_278 = test_minkey;
  test_maxkey_cold_1();
  pcStack_278 = (code *)0x13e3df;
  apcStack_290[0] = (code *)0x13bf5c;
  uStack_280 = uVar9;
  uVar9 = bson_bcon_magic();
  apcStack_290[0] = (code *)0x13bf7a;
  uVar9 = bcon_new(0,"foo",uVar9,0x14,0);
  apcStack_290[0] = (code *)0x13bf82;
  uVar12 = bson_bcone_magic();
  apcStack_290[0] = (code *)0x13bf9a;
  cVar1 = bcon_extract(uVar9,"foo",uVar12,0x14,0);
  if (cVar1 != '\0') {
    bson_destroy(uVar9);
    return;
  }
  apcStack_290[0] = test_bson_document;
  test_minkey_cold_1();
  uStack_298 = 0;
  pcStack_2a0 = "foo";
  apcStack_488[0] = (code *)0x13bfe3;
  uStack_2b8 = uVar9;
  uStack_2b0 = uVar8;
  puStack_2a8 = puVar25;
  apcStack_290[0] = (code *)&stack0xfffffffffffffff8;
  uVar7 = bcon_new(0,"bar","baz",0);
  apcStack_488[0] = (code *)0x13bfeb;
  uVar9 = bson_bcon_magic();
  pcVar27 = "foo";
  apcStack_488[0] = (code *)0x13c00c;
  uVar8 = bcon_new(0,"foo",uVar9,2,uVar7,0);
  apcStack_488[0] = (code *)0x13c014;
  uVar9 = bson_bcone_magic();
  apcStack_488[0] = (code *)0x13c034;
  cVar1 = bcon_extract(uVar8,"foo",uVar9,2,auStack_400,0);
  if (cVar1 == '\0') {
LAB_0013c1b7:
    apcStack_488[0] = (code *)0x13c1bc;
    test_bson_document_cold_1();
LAB_0013c1bc:
    apcStack_488[0] = (code *)0x13c1c1;
    test_bson_document_cold_6();
LAB_0013c1c1:
    apcStack_488[0] = (code *)0x13c1c6;
    test_bson_document_cold_5();
LAB_0013c1c6:
    apcStack_488[0] = (code *)0x13c1cb;
    test_bson_document_cold_2();
  }
  else {
    apcStack_488[0] = (code *)0x13c04c;
    pvVar6 = (void *)bson_get_data(auStack_400);
    apcStack_488[0] = (code *)0x13c057;
    pcVar27 = (char *)bson_get_data(uVar7);
    if (*(uint *)(uVar7 + 4) == uStack_3fc) {
      apcStack_488[0] = (code *)0x13c06b;
      pvVar10 = (void *)bson_get_data(uVar7);
      apcStack_488[0] = (code *)0x13c07b;
      pvVar11 = (void *)bson_get_data(auStack_400);
      apcStack_488[0] = (code *)0x13c089;
      iVar2 = bcmp(pvVar10,pvVar11,(ulong)*(uint *)(uVar7 + 4));
      if (iVar2 == 0) {
        apcStack_488[0] = (code *)0x13c09a;
        bson_destroy(auStack_400);
        apcStack_488[0] = (code *)0x13c0a2;
        bson_destroy(uVar7);
        apcStack_488[0] = (code *)0x13c0aa;
        bson_destroy(uVar8);
        return;
      }
    }
    puVar25 = auStack_400;
    apcStack_488[0] = (code *)0x13c0cb;
    uVar9 = bson_as_canonical_extended_json(puVar25);
    apcStack_488[0] = (code *)0x13c0d8;
    uVar12 = bson_as_canonical_extended_json(uVar7);
    uVar8 = 0xffffffff;
    if (uStack_3fc != 0) {
      uVar19 = 0;
      do {
        if (*(int *)(uVar7 + 4) == (int)uVar19) break;
        if (*(char *)((long)pvVar6 + uVar19) != pcVar27[uVar19]) {
          uVar8 = uVar19 & 0xffffffff;
          break;
        }
        uVar19 = uVar19 + 1;
      } while (uStack_3fc != (uint)uVar19);
    }
    if ((int)uVar8 == -1) {
      uVar3 = uStack_3fc;
      if (uStack_3fc < *(uint *)(uVar7 + 4)) {
        uVar3 = *(uint *)(uVar7 + 4);
      }
      uVar8 = (ulong)(uVar3 - 1);
    }
    apcStack_488[0] = (code *)0x13c133;
    fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar8,uVar9,uVar12);
    apcStack_488[0] = (code *)0x13c14b;
    uVar3 = open("failure.bad.bson",0x42,0x1a0);
    uVar8 = (ulong)uVar3;
    apcStack_488[0] = (code *)0x13c166;
    uVar4 = open("failure.expected.bson",0x42,0x1a0);
    uStack_404 = uVar3;
    if (uVar3 == 0xffffffff) goto LAB_0013c1bc;
    puVar25 = (undefined1 *)(ulong)uVar4;
    if (uVar4 == 0xffffffff) goto LAB_0013c1c1;
    uVar8 = (ulong)uStack_3fc;
    apcStack_488[0] = (code *)0x13c190;
    uVar19 = write(uVar3,pvVar6,uVar8);
    if (uVar19 != uVar8) goto LAB_0013c1c6;
    uVar7 = (ulong)*(uint *)(uVar7 + 4);
    apcStack_488[0] = (code *)0x13c1a6;
    uVar19 = write(uVar4,pcVar27,uVar7);
    if (uVar19 == uVar7) {
      apcStack_488[0] = (code *)0x13c1b7;
      test_bson_document_cold_4();
      goto LAB_0013c1b7;
    }
  }
  apcStack_488[0] = test_bson_array;
  test_bson_document_cold_3();
  pcStack_688 = (code *)0x13c201;
  uStack_4b0 = uVar7;
  uStack_4a8 = uVar8;
  puStack_4a0 = puVar25;
  pcStack_498 = pcVar27;
  pvStack_490 = pvVar6;
  apcStack_488[0] = (code *)apcStack_290;
  uVar7 = bcon_new(0,"0","baz",0);
  pcStack_688 = (code *)0x13c209;
  uVar9 = bson_bcon_magic();
  pcVar27 = "foo";
  pcStack_688 = (code *)0x13c22a;
  uVar8 = bcon_new(0,"foo",uVar9,3,uVar7,0);
  pcStack_688 = (code *)0x13c232;
  uVar9 = bson_bcone_magic();
  pcStack_688 = (code *)0x13c252;
  cVar1 = bcon_extract(uVar8,"foo",uVar9,3,auStack_600,0);
  if (cVar1 == '\0') {
LAB_0013c3d5:
    pcStack_688 = (code *)0x13c3da;
    test_bson_array_cold_1();
LAB_0013c3da:
    pcStack_688 = (code *)0x13c3df;
    test_bson_array_cold_6();
LAB_0013c3df:
    pcStack_688 = (code *)0x13c3e4;
    test_bson_array_cold_5();
LAB_0013c3e4:
    pcStack_688 = (code *)0x13c3e9;
    test_bson_array_cold_2();
  }
  else {
    pcStack_688 = (code *)0x13c26a;
    pvVar6 = (void *)bson_get_data(auStack_600);
    pcStack_688 = (code *)0x13c275;
    pcVar27 = (char *)bson_get_data(uVar7);
    if (*(uint *)(uVar7 + 4) == uStack_5fc) {
      pcStack_688 = (code *)0x13c289;
      pvVar10 = (void *)bson_get_data(uVar7);
      pcStack_688 = (code *)0x13c299;
      pvVar11 = (void *)bson_get_data(auStack_600);
      pcStack_688 = (code *)0x13c2a7;
      iVar2 = bcmp(pvVar10,pvVar11,(ulong)*(uint *)(uVar7 + 4));
      if (iVar2 == 0) {
        pcStack_688 = (code *)0x13c2b8;
        bson_destroy(auStack_600);
        pcStack_688 = (code *)0x13c2c0;
        bson_destroy(uVar7);
        pcStack_688 = (code *)0x13c2c8;
        bson_destroy(uVar8);
        return;
      }
    }
    puVar25 = auStack_600;
    pcStack_688 = (code *)0x13c2e9;
    uVar9 = bson_as_canonical_extended_json(puVar25);
    pcStack_688 = (code *)0x13c2f6;
    uVar12 = bson_as_canonical_extended_json(uVar7);
    uVar8 = 0xffffffff;
    if (uStack_5fc != 0) {
      uVar19 = 0;
      do {
        if (*(int *)(uVar7 + 4) == (int)uVar19) break;
        if (*(char *)((long)pvVar6 + uVar19) != pcVar27[uVar19]) {
          uVar8 = uVar19 & 0xffffffff;
          break;
        }
        uVar19 = uVar19 + 1;
      } while (uStack_5fc != (uint)uVar19);
    }
    if ((int)uVar8 == -1) {
      uVar3 = uStack_5fc;
      if (uStack_5fc < *(uint *)(uVar7 + 4)) {
        uVar3 = *(uint *)(uVar7 + 4);
      }
      uVar8 = (ulong)(uVar3 - 1);
    }
    pcStack_688 = (code *)0x13c351;
    fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar8,uVar9,uVar12);
    pcStack_688 = (code *)0x13c369;
    uVar3 = open("failure.bad.bson",0x42,0x1a0);
    uVar8 = (ulong)uVar3;
    pcStack_688 = (code *)0x13c384;
    uVar4 = open("failure.expected.bson",0x42,0x1a0);
    uStack_604 = uVar3;
    if (uVar3 == 0xffffffff) goto LAB_0013c3da;
    puVar25 = (undefined1 *)(ulong)uVar4;
    if (uVar4 == 0xffffffff) goto LAB_0013c3df;
    uVar8 = (ulong)uStack_5fc;
    pcStack_688 = (code *)0x13c3ae;
    uVar19 = write(uVar3,pvVar6,uVar8);
    if (uVar19 != uVar8) goto LAB_0013c3e4;
    uVar7 = (ulong)*(uint *)(uVar7 + 4);
    pcStack_688 = (code *)0x13c3c4;
    uVar19 = write(uVar4,pcVar27,uVar7);
    if (uVar19 == uVar7) {
      pcStack_688 = (code *)0x13c3d5;
      test_bson_array_cold_4();
      goto LAB_0013c3d5;
    }
  }
  pcStack_688 = test_inline_array;
  test_bson_array_cold_3();
  pcStack_6c0 = (code *)0x13c3fe;
  uStack_6b8 = extraout_RAX_00;
  uStack_6b0 = uVar7;
  uStack_6a8 = uVar8;
  puStack_6a0 = puVar25;
  pcStack_698 = pcVar27;
  pvStack_690 = pvVar6;
  pcStack_688 = (code *)apcStack_488;
  uStack_6e8 = bson_bcon_magic();
  pcStack_6c8 = (char *)0x0;
  pcStack_6d0 = "]";
  puStack_6d8 = (undefined1 *)0x2;
  uStack_6e0 = 0xf;
  uStack_6f0 = 0x13c446;
  uVar9 = bcon_new(0,"foo","[",uStack_6e8,0xf,1);
  pcStack_6c0 = (code *)0x13c452;
  uStack_6e8 = bson_bcone_magic();
  pcStack_6c8 = (char *)0x0;
  pcStack_6d0 = "]";
  uStack_6e0 = 0xf;
  uStack_6f0 = 0x13c481;
  puStack_6d8 = (undefined1 *)&uStack_6b8;
  cVar1 = bcon_extract(uVar9,"foo","[",uStack_6e8,0xf,(long)&uStack_6b8 + 4);
  if (cVar1 == '\0') {
    pcStack_6c0 = (code *)0x13c4b2;
    test_inline_array_cold_1();
LAB_0013c4b2:
    pcStack_6c0 = (code *)0x13c4b7;
    test_inline_array_cold_2();
  }
  else {
    if (uStack_6b8._4_4_ != 1) goto LAB_0013c4b2;
    if ((int)uStack_6b8 == 2) {
      pcStack_6c0 = (code *)0x13c49e;
      bson_destroy(uVar9);
      return;
    }
  }
  pcStack_6c0 = test_inline_doc;
  test_inline_array_cold_3();
  pcStack_6c0 = (code *)0x147feb;
  pcStack_6c8 = "[";
  pcStack_6d0 = "foo";
  puStack_6d8 = (undefined1 *)0x0;
  uStack_6e0 = 0xf;
  pcStack_6f8 = (code *)0x13c4cc;
  uStack_6f0 = extraout_RAX_01;
  uStack_6e8 = uVar9;
  pcStack_720 = (char *)bson_bcon_magic();
  pcStack_700 = (char *)0x0;
  pcStack_708 = "}";
  pcStack_710 = (char *)0x1;
  pcStack_718 = (char *)0xf;
  uStack_728 = "a";
  uStack_730 = 2;
  uStack_738 = 0x13c51f;
  uVar9 = bcon_new(0,"foo","{","b",pcStack_720,0xf);
  pcStack_6f8 = (code *)0x13c52b;
  pcStack_720 = (char *)bson_bcone_magic();
  uStack_730 = (long)&uStack_6f0 + 4;
  pcStack_700 = (char *)0x0;
  pcStack_708 = "}";
  pcStack_718 = (char *)0xf;
  uStack_728 = "b";
  uStack_738 = 0x13c56e;
  pcStack_710 = (char *)&uStack_6f0;
  cVar1 = bcon_extract(uVar9,"foo","{","a",pcStack_720,0xf);
  if (cVar1 == '\0') {
    pcStack_6f8 = (code *)0x13c59f;
    test_inline_doc_cold_1();
LAB_0013c59f:
    pcStack_6f8 = (code *)0x13c5a4;
    test_inline_doc_cold_2();
  }
  else {
    if (uStack_6f0._4_4_ != 1) goto LAB_0013c59f;
    if ((int)uStack_6f0 == 2) {
      pcStack_6f8 = (code *)0x13c58b;
      bson_destroy(uVar9);
      return;
    }
  }
  pcStack_6f8 = test_extract_ctx;
  test_inline_doc_cold_3();
  pcStack_6f8 = (code *)0x0;
  pcStack_700 = "a";
  pcStack_710 = "{";
  pcStack_718 = "foo";
  pcStack_720 = "}";
  pcStack_740 = (code *)0x13c5bc;
  pcStack_708 = (char *)uVar9;
  uStack_778 = (undefined8 *)bson_bcon_magic();
  pcStack_740 = (code *)0x0;
  pcStack_748 = (char *)0x3;
  pbStack_750 = (bson_t *)0xf;
  pcStack_760 = "c";
  pcStack_768 = (char *)0x2;
  pcStack_770 = (char *)0xf;
  uStack_780 = 0x13c5fe;
  uStack_758 = uStack_778;
  bson = (bson_t *)bcon_new(0,"a",uStack_778,0xf,1,"b");
  pcStack_740 = (code *)0x13c60a;
  pcStack_788 = (code *)bson_bcone_magic();
  pbStack_750 = (bson_t *)((long)&uStack_730 + 4);
  uStack_778 = &uStack_728;
  pcStack_748 = (char *)0x0;
  uStack_758 = 0xf;
  pcStack_768 = "c";
  pcStack_770 = (char *)0x0;
  uStack_780 = 0xf;
  pcStack_790 = "b";
  pcStack_798 = (char *)0x0;
  pcStack_7a0 = (char *)0x13c656;
  pcStack_760 = (char *)pcStack_788;
  test_extract_ctx_helper(bson,3,"a",pcStack_788,0xf,(long)&uStack_728 + 4);
  if (uStack_728._4_4_ == 1) {
    if ((int)uStack_728 != 2) goto LAB_0013c68b;
    if (uStack_730._4_4_ == 3) {
      pcStack_740 = (code *)0x13c677;
      bson_destroy(bson);
      return;
    }
  }
  else {
    pcStack_740 = (code *)0x13c68b;
    test_extract_ctx_cold_1();
LAB_0013c68b:
    pcStack_740 = (code *)0x13c690;
    test_extract_ctx_cold_2();
  }
  pcStack_740 = test_nested;
  test_extract_ctx_cold_3();
  pcStack_740 = (code *)0xf;
  pcStack_748 = "a";
  uStack_758 = 0;
  pcStack_768 = "c";
  pcStack_788 = (code *)0x13c6a8;
  pcStack_760 = (char *)((long)&uStack_728 + 4);
  pbStack_750 = bson;
  uStack_7b0 = bson_bcon_magic();
  pcStack_790 = (char *)0x0;
  pcStack_798 = "}";
  pcStack_7a0 = (char *)0xa;
  pcStack_7a8 = (char *)0xf;
  pcStack_7b8 = (char *)0x13c6fd;
  uVar9 = bcon_new(0,"hello","world","foo","{","bar");
  pcStack_788 = (code *)0x13c709;
  uStack_7b0 = bson_bcone_magic();
  pcStack_7a0 = (char *)((long)&uStack_778 + 4);
  pcStack_790 = (char *)0x0;
  pcStack_798 = "}";
  pcStack_7a8 = (char *)0xf;
  pcStack_7b8 = "bar";
  pcStack_7c0 = (code *)0x13f9a8;
  uStack_7c8 = 0x13c745;
  cVar1 = bcon_extract(uVar9,"hello",uStack_7b0,0,&pcStack_770,"foo");
  if (cVar1 == '\0') {
    pcStack_788 = (code *)0x13c785;
    test_nested_cold_1();
LAB_0013c785:
    pcStack_788 = (code *)0x13c78a;
    test_nested_cold_2();
  }
  else {
    pcStack_788 = (code *)0x13c75e;
    iVar2 = strcmp("world",pcStack_770);
    if (iVar2 != 0) goto LAB_0013c785;
    if (uStack_778._4_4_ == 10) {
      pcStack_788 = (code *)0x13c771;
      bson_destroy(uVar9);
      return;
    }
  }
  pcStack_788 = test_skip;
  test_nested_cold_3();
  pcStack_788 = (code *)0x148ce7;
  pcStack_790 = "bar";
  pcStack_798 = (char *)0x0;
  pcStack_7a0 = "hello";
  pcStack_7a8 = "foo";
  pcStack_7c0 = (code *)0x13c79f;
  uStack_7b0 = uVar9;
  pcStack_7e8 = (char *)bson_bcon_magic();
  uStack_7c8 = 0;
  pcStack_7d0 = "}";
  pcStack_7d8 = (char *)0xa;
  pcStack_7e0 = (char *)0xf;
  pcStack_7f0 = (char *)0x13c7f2;
  uVar9 = bcon_new(0,"hello","world","foo","{","bar");
  pcStack_7c0 = (code *)0x13c7fe;
  pcVar27 = (char *)bson_bcone_magic();
  pcVar26 = "}";
  uStack_7c8 = 0;
  pcStack_7d0 = "}";
  pcStack_7d8 = (char *)0x10;
  pcStack_7e0 = (char *)0x1c;
  pcStack_7f0 = "bar";
  pcStack_7f8 = "{";
  uStack_800 = 0x13c83a;
  pcStack_7e8 = pcVar27;
  cVar1 = bcon_extract(uVar9,"hello",pcVar27,0x1c,2);
  if (cVar1 == '\0') {
    pcStack_7c0 = (code *)0x13c89c;
    test_skip_cold_1();
  }
  else {
    uStack_7c8 = 0;
    pcStack_7d0 = "}";
    pcStack_7d8 = (char *)0x12;
    pcStack_7e0 = (char *)0x1c;
    pcStack_7f0 = "bar";
    pcStack_7f8 = "{";
    uStack_800 = 0x13c879;
    pcStack_7e8 = pcVar27;
    cVar1 = bcon_extract(uVar9,"hello",pcVar27,0x1c,2);
    if (cVar1 == '\0') {
      bson_destroy(uVar9);
      return;
    }
  }
  pcStack_7c0 = test_iter;
  test_skip_cold_2();
  pcStack_7c0 = (code *)0x14c89e;
  pcStack_7d0 = "bar";
  pcStack_7d8 = "}";
  pcStack_7e8 = "{";
  apcStack_988[0] = (code *)0x13c8be;
  pcStack_7e0 = pcVar27;
  uStack_7c8 = uVar9;
  __buf = (char *)bson_bcon_magic();
  __n_00 = "foo";
  apcStack_988[0] = (code *)0x13c8e5;
  __n = (char *)bcon_new(0,"foo",__buf,0xf,10);
  apcStack_988[0] = (code *)0x13c8ed;
  uVar9 = bson_bcone_magic();
  pcVar13 = acStack_900;
  pcVar20 = "foo";
  uVar12 = 0x1d;
  uVar23 = 0;
  apcStack_988[0] = (code *)0x13c90d;
  pcVar21 = __n;
  cVar1 = bcon_extract(__n,"foo",uVar9);
  uVar9 = extraout_XMM1_Qa;
  if (cVar1 == '\0') {
LAB_0013cabc:
    apcStack_988[0] = (code *)0x13cac1;
    test_iter_cold_1();
LAB_0013cac1:
    apcStack_988[0] = (code *)0x13cac6;
    test_iter_cold_2();
LAB_0013cac6:
    apcStack_988[0] = (code *)0x13cacb;
    test_iter_cold_3();
LAB_0013cacb:
    apcStack_988[0] = (code *)0x13cad0;
    test_iter_cold_8();
LAB_0013cad0:
    apcStack_988[0] = (code *)0x13cad5;
    test_iter_cold_7();
  }
  else {
    pcVar21 = acStack_900;
    apcStack_988[0] = (code *)0x13c922;
    iVar2 = bson_iter_type();
    uVar9 = extraout_XMM1_Qa_00;
    if (iVar2 != 0x10) goto LAB_0013cac1;
    pcVar21 = acStack_900;
    apcStack_988[0] = (code *)0x13c938;
    iVar2 = bson_iter_int32();
    uVar9 = extraout_XMM1_Qa_01;
    if (iVar2 != 10) goto LAB_0013cac6;
    uVar23 = 0;
    apcStack_988[0] = (code *)0x13c964;
    __n_00 = (char *)bcon_new(0,"foo",__buf,0x1d,acStack_900);
    apcStack_988[0] = (code *)0x13c96f;
    pcVar27 = (char *)bson_get_data(__n_00);
    apcStack_988[0] = (code *)0x13c97a;
    __buf = (char *)bson_get_data(__n);
    if (*(int *)(__n + 4) == *(int *)(__n_00 + 4)) {
      apcStack_988[0] = (code *)0x13c98e;
      pvVar6 = (void *)bson_get_data(__n);
      apcStack_988[0] = (code *)0x13c999;
      pvVar10 = (void *)bson_get_data(__n_00);
      apcStack_988[0] = (code *)0x13c9a7;
      iVar2 = bcmp(pvVar6,pvVar10,(ulong)*(uint *)(__n + 4));
      if (iVar2 == 0) {
        apcStack_988[0] = (code *)0x13c9b3;
        bson_destroy(__n);
        apcStack_988[0] = (code *)0x13c9bb;
        bson_destroy(__n_00);
        return;
      }
    }
    apcStack_988[0] = (code *)0x13c9d4;
    uVar12 = bson_as_canonical_extended_json(__n_00);
    apcStack_988[0] = (code *)0x13c9e1;
    pcVar13 = (char *)bson_as_canonical_extended_json(__n);
    uVar3 = *(uint *)(__n_00 + 4);
    uVar7 = 0xffffffff;
    if (uVar3 != 0) {
      uVar8 = 0;
      do {
        if (*(int *)(__n + 4) == (int)uVar8) break;
        if (pcVar27[uVar8] != __buf[uVar8]) {
          uVar7 = uVar8 & 0xffffffff;
          break;
        }
        uVar8 = uVar8 + 1;
      } while (uVar3 != (uint)uVar8);
    }
    if ((int)uVar7 == -1) {
      if (uVar3 < *(uint *)(__n + 4)) {
        uVar3 = *(uint *)(__n + 4);
      }
      uVar7 = (ulong)(uVar3 - 1);
    }
    apcStack_988[0] = (code *)0x13ca3c;
    uVar9 = extraout_XMM1_Qa_02;
    fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar7);
    apcStack_988[0] = (code *)0x13ca54;
    uVar3 = open("failure.bad.bson",0x42,0x1a0);
    pcVar26 = (char *)(ulong)uVar3;
    pcVar21 = "failure.expected.bson";
    pcVar20 = (char *)0x42;
    apcStack_988[0] = (code *)0x13ca6f;
    uVar4 = open("failure.expected.bson",0x42,0x1a0);
    uStack_904 = uVar3;
    if (uVar3 == 0xffffffff) goto LAB_0013cacb;
    if (uVar4 == 0xffffffff) goto LAB_0013cad0;
    pcVar26 = (char *)(ulong)uVar4;
    __n_00 = (char *)(ulong)*(uint *)(__n_00 + 4);
    pcVar21 = (char *)(ulong)uVar3;
    apcStack_988[0] = (code *)0x13ca95;
    pcVar20 = pcVar27;
    pcVar14 = (char *)write(uVar3,pcVar27,(size_t)__n_00);
    if (pcVar14 == __n_00) {
      __n = (char *)(ulong)*(uint *)(__n + 4);
      apcStack_988[0] = (code *)0x13caab;
      pcVar20 = __buf;
      pcVar21 = pcVar26;
      pcVar14 = (char *)write(uVar4,__buf,(size_t)__n);
      if (pcVar14 != __n) goto LAB_0013cada;
      pcVar21 = (char *)(ulong)uStack_904;
      pcVar20 = (char *)(ulong)uVar4;
      apcStack_988[0] = (code *)0x13cabc;
      test_iter_cold_6();
      goto LAB_0013cabc;
    }
  }
  apcStack_988[0] = (code *)0x13cada;
  test_iter_cold_4();
LAB_0013cada:
  apcStack_988[0] = test_extract_ctx_helper;
  test_iter_cold_5();
  puStack_6fc0 = auStack_6fb0;
  if (extraout_AL != '\0') {
    uStack_6f70 = uVar9;
  }
  puStack_7008 = (undefined8 *)0x13cb62;
  pcStack_6fa8 = pcVar20;
  uStack_6f98 = uVar12;
  pcStack_6f90 = pcVar13;
  uStack_6f88 = uVar23;
  pcStack_9a8 = __n;
  pcStack_9a0 = pcVar27;
  pcStack_998 = __buf;
  pcStack_990 = __n_00;
  apcStack_988[0] = (code *)&pcStack_7c0;
  bcon_extract_ctx_init(aDStack_6f00);
  puStack_6fc8 = auStack_978;
  uStack_6fd0 = 0x3000000010;
  uVar9 = 0x10;
  if (0 < (int)(uint)pcStack_6fa8) {
    uVar3 = (uint)pcStack_6fa8;
    do {
      puStack_7008 = (undefined8 *)0x13cbce;
      __s = aDStack_6f00;
      pcVar27 = pcVar21;
      cVar1 = bcon_extract_ctx_va(pcVar21,aDStack_6f00,&uStack_6fd0);
      iVar2 = (int)uVar9;
      if (cVar1 == '\0') {
        puStack_7008 = (undefined8 *)0x13cbe9;
        test_extract_ctx_helper_cold_1();
        pcStack_7030 = (code *)0x13cc03;
        __name = __s;
        pcStack_7028 = pcVar21;
        uStack_7020 = (ulong)uVar3;
        pcStack_7018 = pcVar26;
        pDStack_7010 = aDStack_6f00;
        puStack_7008 = &uStack_6fd0;
        pcVar26 = (char *)strlen(pcVar27);
        pcStack_7030 = (code *)0x13cc0e;
        pDVar22 = __s;
        sVar15 = strlen((char *)__s);
        if ((int)sVar15 + (int)pcVar26 < 499) {
          pcStack_7030 = (code *)0x13cc2a;
          memset(__dest,0,500);
          pcStack_7030 = (code *)0x13cc38;
          strncat(__dest,pcVar27,(long)(int)pcVar26);
          pcStack_7030 = (code *)0x13cc40;
          sVar16 = strlen(__dest);
          (__dest + sVar16)[0] = '/';
          (__dest + sVar16)[1] = '\0';
          pcStack_7030 = (code *)0x13cc54;
          strncat(__dest,(char *)__s,(long)(int)sVar15);
          pcVar27 = __dest;
          do {
            if (*pcVar27 == '\\') {
              *pcVar27 = '/';
            }
            else if (*pcVar27 == '\0') {
              return;
            }
            pcVar27 = pcVar27 + 1;
          } while( true );
        }
        pcStack_7030 = collect_tests_from_dir;
        assemble_path_cold_1();
        uVar7 = (ulong)extraout_EDX;
        pDStack_72f8 = (DIR *)0x13cc9e;
        __filename = __name;
        iStack_72ec = iVar2;
        sStack_7050 = sVar15;
        pcStack_7048 = pcVar26;
        pDStack_7040 = __s;
        pcStack_7038 = pcVar27;
        pcStack_7030 = (code *)apcStack_988;
        __dirp = opendir((char *)__name);
        pDVar24 = pDVar22;
        pDStack_7300 = __s;
        if (__dirp == (DIR *)0x0) goto LAB_0013cdc9;
        pDStack_72f8 = (DIR *)0x13ccb2;
        __filename = __dirp;
        pdVar17 = readdir(__dirp);
        if (pdVar17 == (dirent *)0x0) goto LAB_0013cda8;
        pcVar26 = "..";
        pDVar24 = (DIR *)0x147699;
        pDStack_72e8 = pDVar22;
        goto LAB_0013ccd1;
      }
      uVar3 = uVar3 - 1;
    } while (uVar3 != 0);
  }
  return;
LAB_0013cd12:
  pDStack_72f8 = (DIR *)0x13cd25;
  assemble_path((char *)__name,pcVar27,acStack_7250);
  pDStack_72f8 = (DIR *)0x13cd32;
  iVar5 = stat(pcVar27,&sStack_72e0);
  if ((iVar5 == 0) && ((sStack_72e0.st_mode & 0xf000) == 0x4000)) {
    pDStack_72f8 = (DIR *)0x13cd60;
    uVar3 = collect_tests_from_dir((char (*) [500])pDStack_72e8,acStack_7250,iVar2,iStack_72ec);
    uVar7 = (ulong)uVar3;
  }
  else {
    pDStack_72f8 = (DIR *)0x13cd73;
    pcVar13 = strstr(pcVar27,".json");
    if (pcVar13 != (char *)0x0) {
      uVar7 = (ulong)(iVar2 + 1);
      pDStack_72f8 = (DIR *)0x13cd94;
      assemble_path((char *)__name,pcVar27,(char *)(pDStack_72e8 + (long)iVar2 * 500));
    }
  }
  pDStack_72f8 = (DIR *)0x13cd9c;
  __filename = __dirp;
  pdVar17 = readdir(__dirp);
  if (pdVar17 == (dirent *)0x0) {
LAB_0013cda8:
    pDStack_72f8 = (DIR *)0x13cdb0;
    closedir(__dirp);
    return;
  }
LAB_0013ccd1:
  iVar2 = (int)uVar7;
  if (iVar2 < iStack_72ec) {
    do {
      pcVar27 = pdVar17->d_name;
      pDStack_72f8 = (DIR *)0x13ccea;
      iVar5 = strcmp(pcVar27,"..");
      if (iVar5 != 0) {
        pDStack_72f8 = (DIR *)0x13ccf9;
        iVar5 = strcmp(pcVar27,".");
        if (iVar5 != 0) goto LAB_0013cd12;
      }
      pDStack_72f8 = (DIR *)0x13cd05;
      pdVar17 = readdir(__dirp);
      if (pdVar17 == (dirent *)0x0) goto LAB_0013cda8;
    } while( true );
  }
  pDStack_72f8 = (DIR *)0x13cdc9;
  collect_tests_from_dir_cold_1();
  pDStack_7300 = __dirp;
LAB_0013cdc9:
  pDStack_72f8 = (DIR *)get_bson_from_json_file;
  collect_tests_from_dir_cold_2();
  uStack_7318 = uVar7;
  pDStack_7310 = pDVar24;
  pcStack_7308 = pcVar26;
  pDStack_72f8 = __name;
  __stream = fopen((char *)__filename,"rb");
  if (__stream != (FILE *)0x0) {
    fseek(__stream,0,2);
    sVar15 = ftell(__stream);
    fseek(__stream,0,0);
    if (0 < (long)sVar15) {
      pvVar6 = (void *)bson_malloc0(sVar15);
      sVar16 = fread(pvVar6,1,sVar15,__stream);
      if (sVar16 != sVar15) {
        abort();
      }
      fclose(__stream);
      if (pvVar6 != (void *)0x0) {
        lVar18 = bson_new_from_json(pvVar6,sVar15,auStack_7518);
        if (lVar18 == 0) {
          fprintf(_stderr,"Cannot parse %s: %s\n",__filename,auStack_7510);
          abort();
        }
        bson_free(pvVar6);
      }
    }
  }
  return;
}

Assistant:

static void
test_codewscope (void)
{
   const char *code;
   bson_t oscope;

   bson_t *scope = BCON_NEW ("b", BCON_INT32 (10));
   bson_t *bcon = BCON_NEW ("foo", BCON_CODEWSCOPE ("var a = b;", scope));

   BSON_ASSERT (BCON_EXTRACT (bcon, "foo", BCONE_CODEWSCOPE (code, oscope)));

   BSON_ASSERT (strcmp (code, "var a = b;") == 0);
   bson_eq_bson (&oscope, scope);

   bson_destroy (&oscope);
   bson_destroy (scope);
   bson_destroy (bcon);
}